

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

UniValue * find_value(UniValue *obj,string *name)

{
  pointer pbVar1;
  __type _Var2;
  const_reference pvVar3;
  uint uVar4;
  ulong __n;
  
  uVar4 = 0;
  do {
    __n = (ulong)uVar4;
    pbVar1 = (obj->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(obj->keys).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= __n) {
      return &NullUniValue;
    }
    _Var2 = std::operator==(pbVar1 + __n,name);
    uVar4 = uVar4 + 1;
  } while (!_Var2);
  pvVar3 = std::vector<UniValue,_std::allocator<UniValue>_>::at(&obj->values,__n);
  return pvVar3;
}

Assistant:

const UniValue& find_value(const UniValue& obj, const std::string& name)
{
    for (unsigned int i = 0; i < obj.keys.size(); i++)
        if (obj.keys[i] == name)
            return obj.values.at(i);

    return NullUniValue;
}